

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_utils.c
# Opt level: O2

HPDF_INT HPDF_MemCmp(HPDF_BYTE *s1,HPDF_BYTE *s2,HPDF_UINT n)

{
  long lVar1;
  
  if (n != 0) {
    lVar1 = 0;
    while( true ) {
      if (s1[lVar1] != s2[lVar1]) {
        return (uint)s1[lVar1] - (uint)s2[lVar1];
      }
      if (n - 1 == (int)lVar1) break;
      lVar1 = lVar1 + 1;
    }
  }
  return 0;
}

Assistant:

HPDF_INT
HPDF_MemCmp  (const HPDF_BYTE   *s1,
              const HPDF_BYTE   *s2,
              HPDF_UINT          n)
{
    if (n == 0)
        return 0;

    while (*s1 == *s2) {
        n--;
        if (n == 0)
            return 0;
        s1++;
        s2++;
    }

    return *s1 - *s2;
}